

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::loadTestNamesFromFile(ConfigData *config,string *_filename)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  undefined8 uVar4;
  domain_error *this;
  istream *piVar5;
  string *in_RDI;
  string line;
  ifstream f;
  string *_testSpec;
  undefined6 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd8;
  byte local_31a;
  undefined7 in_stack_fffffffffffffd00;
  string *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  string local_2d8 [37];
  byte local_2b3;
  byte local_2b2;
  undefined1 local_2b1 [33];
  string local_290 [32];
  string local_270 [39];
  undefined1 local_249;
  string local_248 [48];
  istream local_218 [528];
  string *local_8;
  
  local_8 = in_RDI;
  uVar4 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_218,uVar4,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::string(local_270);
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_270);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if (!bVar2) break;
      trim(in_stack_fffffffffffffd08);
      std::__cxx11::string::operator=(local_270,local_290);
      std::__cxx11::string::~string(local_290);
      uVar3 = std::__cxx11::string::empty();
      local_2b2 = 0;
      local_2b3 = 0;
      local_31a = 0;
      if ((uVar3 & 1) == 0) {
        in_stack_fffffffffffffcd8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b1;
        std::allocator<char>::allocator();
        local_2b2 = 1;
        std::__cxx11::string::string
                  ((string *)(local_2b1 + 1),"#",(allocator *)in_stack_fffffffffffffcd8);
        local_2b3 = 1;
        in_stack_fffffffffffffcd7 =
             startsWith(in_stack_fffffffffffffd08,
                        (string *)CONCAT17(bVar1,in_stack_fffffffffffffd00));
        local_31a = in_stack_fffffffffffffcd7 ^ 0xff;
      }
      if ((local_2b3 & 1) != 0) {
        std::__cxx11::string::~string((string *)(local_2b1 + 1));
      }
      if ((local_2b2 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)local_2b1);
      }
      if ((local_31a & 1) != 0) {
        _testSpec = local_8;
        std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
        std::operator+(in_stack_fffffffffffffcd8,
                       (char *)CONCAT17(in_stack_fffffffffffffcd7,
                                        CONCAT16(local_31a,in_stack_fffffffffffffcd0)));
        addTestOrTags((ConfigData *)
                      CONCAT17(in_stack_fffffffffffffcd7,
                               CONCAT16(local_31a,in_stack_fffffffffffffcd0)),_testSpec);
        std::__cxx11::string::~string(local_2d8);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffd08);
      }
    }
    std::__cxx11::string::~string(local_270);
    std::ifstream::~ifstream(local_218);
    return;
  }
  local_249 = 1;
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  std::domain_error::domain_error(this,local_248);
  local_249 = 0;
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline void loadTestNamesFromFile( ConfigData& config, std::string const& _filename ) {
        std::ifstream f( _filename.c_str() );
        if( !f.is_open() )
            throw std::domain_error( "Unable to load input file: " + _filename );

        std::string line;
        while( std::getline( f, line ) ) {
            line = trim(line);
            if( !line.empty() && !startsWith( line, "#" ) )
                addTestOrTags( config, "\"" + line + "\"," );
        }
    }